

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_service_client(t_ocaml_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_function *ptVar2;
  t_struct *ptVar3;
  pointer pcVar4;
  t_type *returntype;
  undefined **ppuVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  int iVar9;
  ostream *poVar10;
  pointer pptVar11;
  long *plVar12;
  size_type *psVar13;
  char *pcVar14;
  pointer pptVar15;
  string res;
  string resultname;
  t_struct noargs;
  string argsname;
  string funname;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_function recv_function;
  string local_3a0;
  pointer local_380;
  string local_378;
  string local_358;
  ofstream_with_content_based_conditional_update *local_338;
  undefined1 local_330 [17];
  undefined7 uStack_31f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_318;
  bool local_308;
  _Rb_tree_node_base local_2f8;
  size_t local_2d8;
  t_program *local_2d0;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  pointer pptStack_2a0;
  pointer local_298;
  pointer pptStack_290;
  pointer local_288;
  undefined7 uStack_280;
  undefined4 uStack_279;
  int local_274;
  bool local_270;
  undefined **local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  ulong uStack_250;
  string local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  undefined8 uStack_1f0;
  undefined **local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  ulong uStack_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  char *local_1a8;
  long local_1a0;
  char local_198 [16];
  char *local_188;
  long local_180;
  char local_178 [16];
  string local_168;
  vector<t_function_*,_std::allocator<t_function_*>_> local_148;
  string local_130;
  string local_110;
  string local_f0;
  t_function local_d0;
  
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
  os = &this->f_service_;
  poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"class client (iprot : Protocol.t) (oprot : Protocol.t) =",0x38);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"object (self)",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_338 = &this->f_service_i_;
  poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_338);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"class client : Protocol.t -> Protocol.t -> ",0x2b);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"object",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_((string *)local_330,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_188,(string *)local_330);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"inherit ",8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_188,local_180);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".client iprot oprot as super",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_338);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"inherit ",8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_188,local_180);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".client",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"val mutable seqid = 0",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_148,&tservice->functions_)
  ;
  pptVar11 = local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  while (pptVar11 !=
         local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    ptVar2 = *pptVar11;
    ptVar3 = ptVar2->arglist_;
    local_1a8 = local_198;
    pcVar4 = (ptVar2->name_)._M_dataplus._M_p;
    local_380 = pptVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar4,pcVar4 + (ptVar2->name_)._M_string_length);
    poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"method ",7);
    ptVar2 = *local_380;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    function_signature((string *)local_330,this,ptVar2,&local_f0);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_338);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"method ",7);
    pcVar4 = ((*local_380)->name_)._M_dataplus._M_p;
    local_268 = (undefined **)&local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,pcVar4,pcVar4 + ((*local_380)->name_)._M_string_length);
    ppuVar5 = local_268;
    iVar9 = tolower((int)*(char *)local_268);
    *(char *)ppuVar5 = (char)iVar9;
    paVar6 = local_260;
    if (local_268 == (undefined **)&local_258) {
      aStack_318._0_8_ = uStack_250;
      local_268 = (undefined **)(local_330 + 0x10);
    }
    uStack_31f = uStack_257;
    local_330[0x10] = local_258;
    local_330._8_8_ = local_260;
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_258 = 0;
    local_330._0_8_ = local_268;
    ppuVar5 = local_268;
    local_268 = (undefined **)&local_258;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)ppuVar5,(long)paVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," : ",3);
    function_type_abi_cxx11_((string *)&local_d0,this,*local_380,true,false);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_d0.super_t_doc._vptr_t_doc,
                         (long)local_d0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    if (local_268 != (undefined **)&local_258) {
      operator_delete(local_268);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"self#send_",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1a8,local_1a0);
    for (pptVar15 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," ",1);
      pcVar4 = ((*pptVar15)->name_)._M_dataplus._M_p;
      local_1e8 = (undefined **)&local_1d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar4,pcVar4 + ((*pptVar15)->name_)._M_string_length);
      ppuVar5 = local_1e8;
      iVar9 = tolower((int)*(char *)local_1e8);
      *(char *)ppuVar5 = (char)iVar9;
      paVar6 = local_1e0;
      if (local_1e8 == (undefined **)&local_1d8) {
        aStack_318._0_8_ = uStack_1d0;
        local_1e8 = (undefined **)(local_330 + 0x10);
      }
      uStack_31f = uStack_1d7;
      local_330[0x10] = local_1d8;
      local_330._8_8_ = local_1e0;
      local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_1d8 = 0;
      local_330._0_8_ = local_1e8;
      ppuVar5 = local_1e8;
      local_1e8 = (undefined **)&local_1d8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,(char *)ppuVar5,(long)paVar6)
      ;
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_);
      }
      if (local_1e8 != (undefined **)&local_1d8) {
        operator_delete(local_1e8);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((*local_380)->oneway_ == false) {
      t_generator::indent_abi_cxx11_((string *)local_330,(t_generator *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,(char *)local_330._0_8_,local_330._8_8_);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"self#recv_",10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_1a8,local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"method private send_",0x14);
    ptVar2 = *local_380;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    function_signature((string *)local_330,this,ptVar2,&local_110);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    local_208 = &local_1f8;
    pcVar4 = ((*local_380)->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar4,pcVar4 + ((*local_380)->name_)._M_string_length);
    std::__cxx11::string::append((char *)&local_208);
    pcVar14 = local_208;
    iVar9 = tolower((int)*local_208);
    *pcVar14 = (char)iVar9;
    local_1c8 = &local_1b8;
    if (local_208 == &local_1f8) {
      uStack_1b0 = uStack_1f0;
    }
    else {
      local_1c8 = local_208;
    }
    _local_1b8 = CONCAT71(uStack_1f7,local_1f8);
    local_1c0 = local_200;
    local_200 = 0;
    local_1f8 = '\0';
    local_208 = &local_1f8;
    t_generator::indent_abi_cxx11_((string *)local_330,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)os,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"oprot#writeMessageBegin (\"",0x1a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,((*local_380)->name_)._M_dataplus._M_p,
                         ((*local_380)->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\", ",3);
    pcVar14 = "Protocol.CALL";
    if ((*local_380)->oneway_ != false) {
      pcVar14 = "Protocol.ONEWAY";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,pcVar14,(ulong)(*local_380)->oneway_ * 2 + 0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", seqid);",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    t_generator::indent_abi_cxx11_((string *)local_330,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)os,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"let args = new ",0xf);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," in",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar15 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      t_generator::indent_abi_cxx11_((string *)local_330,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"args#set_",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,((*pptVar15)->name_)._M_dataplus._M_p,
                           ((*pptVar15)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,((*pptVar15)->name_)._M_dataplus._M_p,
                           ((*pptVar15)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_);
      }
    }
    t_generator::indent_abi_cxx11_((string *)local_330,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)os,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"args#write oprot;",0x11);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)&local_d0,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_d0.super_t_doc._vptr_t_doc,
                         (long)local_d0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"oprot#writeMessageEnd;",0x16);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_358,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_358._M_dataplus._M_p,local_358._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"oprot#getTransport#flush",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p);
    }
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -2;
    ptVar2 = *local_380;
    if (ptVar2->oneway_ == false) {
      local_228 = &local_218;
      pcVar4 = (ptVar2->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar4,pcVar4 + (ptVar2->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_228);
      paVar6 = local_228;
      iVar9 = tolower((int)local_228->_M_local_buf[0]);
      paVar6->_M_local_buf[0] = (char)iVar9;
      pptVar11 = local_380;
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      if (local_228 == &local_218) {
        local_358.field_2._8_8_ = local_218._8_8_;
      }
      else {
        local_358._M_dataplus._M_p = (pointer)local_228;
      }
      local_358.field_2._M_allocated_capacity._1_7_ = local_218._M_allocated_capacity._1_7_;
      local_358.field_2._M_local_buf[0] = local_218._M_local_buf[0];
      local_358._M_string_length = local_220;
      local_220 = 0;
      local_218._M_local_buf[0] = '\0';
      local_2d0 = (this->super_t_oop_generator).super_t_generator.program_;
      local_330._8_8_ = &aStack_318;
      stack0xfffffffffffffce0 = 0;
      aStack_318._0_8_ = aStack_318._0_8_ & 0xffffffffffffff00;
      local_308 = false;
      local_2f8._M_color = _S_red;
      local_2f8._M_parent = (_Base_ptr)0x0;
      local_2f8._M_left = &local_2f8;
      local_2d8 = 0;
      local_2c8._M_p = (pointer)&local_2b8;
      local_2c0 = 0;
      local_2b8._M_local_buf[0] = '\0';
      local_330._0_8_ = &PTR__t_struct_0040eeb8;
      local_274 = 0;
      local_270 = false;
      local_288 = (pointer)0x0;
      uStack_280 = 0;
      uStack_279 = 0;
      local_298 = (pointer)0x0;
      pptStack_290 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      pptStack_2a0 = (pointer)0x0;
      returntype = (*local_380)->returntype_;
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      local_2f8._M_right = local_2f8._M_left;
      local_228 = &local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"recv_","");
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_378,(ulong)((*pptVar11)->name_)._M_dataplus._M_p);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar13 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168.field_2._8_8_ = plVar12[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_168._M_string_length = plVar12[1];
      *plVar12 = (long)psVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      t_function::t_function(&local_d0,returntype,&local_168,(t_struct *)local_330,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_378,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_378._M_dataplus._M_p,local_378._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"method private ",0xf);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
      function_signature(&local_3a0,this,&local_d0,&local_130);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," =",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_378,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_378._M_dataplus._M_p,local_378._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"let (fname, mtype, rseqid) = iprot#readMessageBegin in",0x36);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_378,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_378._M_dataplus._M_p,local_378._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"(if mtype = Protocol.EXCEPTION then",0x23);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"  let x = Application_Exn.read iprot in",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_378,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_378._M_dataplus._M_p,local_378._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  (iprot#readMessageEnd;",0x18);
      t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"   raise (Application_Exn.E x))",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_378,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_378._M_dataplus._M_p,local_378._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"else ());",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"_","");
      ptVar3 = (*local_380)->xceptions_;
      iVar9 = (*((*local_380)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if (((char)iVar9 == '\0') ||
         ((ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_378,0,(char *)local_378._M_string_length,0x37b210);
      }
      t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"let ",4);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_378._M_dataplus._M_p,local_378._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = read_",8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_358._M_dataplus._M_p,local_358._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," iprot in",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"iprot#readMessageEnd;",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      iVar9 = (*((*local_380)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar9 == '\0') {
        t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)os,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"match result#get_success with Some v -> v | None -> (",0x35);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
      for (pptVar15 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar15 !=
          (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
        t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)os,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(match result#get_",0x12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,((*pptVar15)->name_)._M_dataplus._M_p,
                             ((*pptVar15)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," with None -> () | Some _v ->",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  raise (",9);
        type_name_abi_cxx11_(&local_248,this,(*pptVar15)->type_);
        _Var7._M_p = local_248._M_dataplus._M_p;
        iVar9 = toupper((int)*local_248._M_dataplus._M_p);
        sVar8 = local_248._M_string_length;
        *_Var7._M_p = (char)iVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p == &local_248.field_2) {
          local_3a0.field_2._8_8_ = local_248.field_2._8_8_;
          local_248._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        }
        local_3a0.field_2._M_allocated_capacity._1_7_ =
             local_248.field_2._M_allocated_capacity._1_7_;
        local_3a0.field_2._M_local_buf[0] = local_248.field_2._M_local_buf[0];
        local_3a0._M_string_length = local_248._M_string_length;
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        local_3a0._M_dataplus._M_p = local_248._M_dataplus._M_p;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_248._M_dataplus._M_p;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,paVar6->_M_local_buf,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," _v));",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
      }
      iVar9 = (*((*local_380)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar9 == '\0') {
        t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)os,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,
                   "raise (Application_Exn.E (Application_Exn.create Application_Exn.MISSING_RESULT \""
                   ,0x51);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,((*local_380)->name_)._M_dataplus._M_p,
                             ((*local_380)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," failed: unknown result\")))",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        iVar9 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
        (this->super_t_oop_generator).super_t_generator.indent_ = iVar9;
      }
      else {
        poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"()",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        iVar9 = (this->super_t_oop_generator).super_t_generator.indent_;
      }
      (this->super_t_oop_generator).super_t_generator.indent_ = iVar9 + -3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      t_function::~t_function(&local_d0);
      local_330._0_8_ = &PTR__t_struct_0040eeb8;
      if (pptStack_290 != (pointer)0x0) {
        operator_delete(pptStack_290);
      }
      if (local_2a8 != (pointer)0x0) {
        operator_delete(local_2a8);
      }
      t_type::~t_type((t_type *)local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p);
      }
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    pptVar11 = local_380 + 1;
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar10 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"end",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_338);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"end",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  indent(f_service_) << "class client (iprot : Protocol.t) (oprot : Protocol.t) =" << endl
                     << "object (self)" << endl;
  indent(f_service_i_) << "class client : Protocol.t -> Protocol.t -> " << endl << "object" << endl;
  indent_up();

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    indent(f_service_) << "inherit " << extends << ".client iprot oprot as super" << endl;
    indent(f_service_i_) << "inherit " << extends << ".client" << endl;
  }
  indent(f_service_) << "val mutable seqid = 0" << endl;

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* arg_struct = (*f_iter)->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "method " << function_signature(*f_iter) << " = " << endl;
    indent(f_service_i_) << "method " << decapitalize((*f_iter)->get_name()) << " : "
                         << function_type(*f_iter, true, false) << endl;
    indent_up();
    indent(f_service_) << "self#send_" << funname;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << " " << decapitalize((*fld_iter)->get_name());
    }
    f_service_ << ";" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      f_service_ << "self#recv_" << funname << endl;
    }
    indent_down();

    indent(f_service_) << "method private send_" << function_signature(*f_iter) << " = " << endl;
    indent_up();

    std::string argsname = decapitalize((*f_iter)->get_name() + "_args");

    // Serialize the request header
    f_service_ << indent() << "oprot#writeMessageBegin (\"" << (*f_iter)->get_name() << "\", "
               << ((*f_iter)->is_oneway() ? "Protocol.ONEWAY" : "Protocol.CALL") << ", seqid);"
               << endl;

    f_service_ << indent() << "let args = new " << argsname << " in" << endl;
    indent_up();

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args#set_" << (*fld_iter)->get_name() << " "
                 << (*fld_iter)->get_name() << ";" << endl;
    }

    // Write to the stream
    f_service_ << indent() << "args#write oprot;" << endl << indent() << "oprot#writeMessageEnd;"
               << endl << indent() << "oprot#getTransport#flush" << endl;

    indent_down();
    indent_down();

    if (!(*f_iter)->is_oneway()) {
      std::string resultname = decapitalize((*f_iter)->get_name() + "_result");
      t_struct noargs(program_);

      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs);
      // Open function
      f_service_ << indent() << "method private " << function_signature(&recv_function) << " ="
                 << endl;
      indent_up();

      // TODO(mcslee): Validate message reply here, seq ids etc.

      f_service_ << indent() << "let (fname, mtype, rseqid) = iprot#readMessageBegin in" << endl;
      indent_up();
      f_service_ << indent() << "(if mtype = Protocol.EXCEPTION then" << endl << indent()
                 << "  let x = Application_Exn.read iprot in" << endl;
      indent_up();
      f_service_ << indent() << "  (iprot#readMessageEnd;" << indent()
                 << "   raise (Application_Exn.E x))" << endl;
      indent_down();
      f_service_ << indent() << "else ());" << endl;
      string res = "_";

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();

      if (!(*f_iter)->get_returntype()->is_void() || xceptions.size() > 0) {
        res = "result";
      }
      f_service_ << indent() << "let " << res << " = read_" << resultname << " iprot in" << endl;
      indent_up();
      f_service_ << indent() << "iprot#readMessageEnd;" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "match result#get_success with Some v -> v | None -> (" << endl;
        indent_up();
      }

      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "(match result#get_" << (*x_iter)->get_name()
                   << " with None -> () | Some _v ->" << endl;
        indent(f_service_) << "  raise (" << capitalize(type_name((*x_iter)->get_type()))
                           << " _v));" << endl;
      }

      // Careful, only return _result if not a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "()" << endl;
      } else {
        f_service_
            << indent()
            << "raise (Application_Exn.E (Application_Exn.create Application_Exn.MISSING_RESULT \""
            << (*f_iter)->get_name() << " failed: unknown result\")))" << endl;
        indent_down();
      }

      // Close function
      indent_down();
      indent_down();
      indent_down();
    }
  }

  indent_down();
  indent(f_service_) << "end" << endl << endl;
  indent(f_service_i_) << "end" << endl << endl;
}